

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

ref_entry * cram_ref_load(refs_t *r,int id)

{
  ref_entry **pprVar1;
  int iVar2;
  long lVar3;
  BGZF *pBVar4;
  char *pcVar5;
  char *seq;
  int end;
  int start;
  ref_entry *e;
  int id_local;
  refs_t *r_local;
  
  r_local = (refs_t *)r->ref_id[id];
  pprVar1 = r_local->ref_id;
  if (*(char **)&r_local->count != (char *)0x0) {
    return (ref_entry *)r_local;
  }
  if (r_local->fp == (BGZF *)0x0) {
    if (r->last != (ref_entry *)0x0) {
      if (r->last->count < 1) {
        __assert_fail("r->last->count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                      ,0x8a2,"ref_entry *cram_ref_load(refs_t *, int)");
      }
      lVar3 = r->last->count + -1;
      r->last->count = lVar3;
      if ((lVar3 < 1) && (r->last->seq != (char *)0x0)) {
        free(r->last->seq);
        r->last->seq = (char *)0x0;
      }
    }
    iVar2 = strcmp(r->fn,(char *)r_local->h_meta);
    if ((iVar2 != 0) || (r->fp == (BGZF *)0x0)) {
      if ((r->fp != (BGZF *)0x0) && (iVar2 = bgzf_close(r->fp), iVar2 != 0)) {
        return (ref_entry *)0x0;
      }
      r->fn = (char *)r_local->h_meta;
      pBVar4 = bgzf_open_ref(r->fn,"r");
      r->fp = pBVar4;
      if (pBVar4 == (BGZF *)0x0) {
        return (ref_entry *)0x0;
      }
    }
    pcVar5 = load_ref_portion(r->fp,(ref_entry *)r_local,1,(int)pprVar1);
    if (pcVar5 == (char *)0x0) {
      r_local = (refs_t *)0x0;
    }
    else {
      *(char **)&r_local->count = pcVar5;
      r_local->fp = (BGZF *)&r_local->fp->field_0x1;
      r->last = (ref_entry *)r_local;
      r_local->fp = (BGZF *)&r_local->fp->field_0x1;
    }
    return (ref_entry *)r_local;
  }
  __assert_fail("e->count == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                ,0x898,"ref_entry *cram_ref_load(refs_t *, int)");
}

Assistant:

ref_entry *cram_ref_load(refs_t *r, int id) {
    ref_entry *e = r->ref_id[id];
    int start = 1, end = e->length;
    char *seq;

    if (e->seq) {
	return e;
    }

    assert(e->count == 0);

    if (r->last) {
#ifdef REF_DEBUG
	int idx = 0;
	for (idx = 0; idx < r->nref; idx++)
	    if (r->last == r->ref_id[idx])
		break;
	RP("%d cram_ref_load DECR %d\n", gettid(), idx);
#endif
	assert(r->last->count > 0);
	if (--r->last->count <= 0) {
	    RP("%d FREE REF %d (%p)\n", gettid(), id, r->ref_id[id]->seq);
	    if (r->last->seq) {
		free(r->last->seq);
		r->last->seq = NULL;
	    }
	}
    }

    /* Open file if it's not already the current open reference */
    if (strcmp(r->fn, e->fn) || r->fp == NULL) {
	if (r->fp)
	    if (bgzf_close(r->fp) != 0)
		return NULL;
	r->fn = e->fn;
	if (!(r->fp = bgzf_open_ref(r->fn, "r")))
	    return NULL;
    }

    RP("%d Loading ref %d (%d..%d)\n", gettid(), id, start, end);

    if (!(seq = load_ref_portion(r->fp, e, start, end))) {
	return NULL;
    }

    RP("%d Loaded ref %d (%d..%d) = %p\n", gettid(), id, start, end, seq);

    RP("%d INC REF %d, %d\n", gettid(), id, (int)(e->count+1));
    e->seq = seq;
    e->count++;

    /*
     * Also keep track of last used ref so incr/decr loops on the same
     * sequence don't cause load/free loops.
     */
    RP("%d cram_ref_load INCR %d => %d\n", gettid(), id, e->count+1);
    r->last = e;
    e->count++; 

    return e;
}